

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Strsafe_init(void)

{
  s_x1node *psVar1;
  int local_c;
  int i;
  
  if ((x1a == (s_x1 *)0x0) && (x1a = (s_x1 *)malloc(0x18), x1a != (s_x1 *)0x0)) {
    x1a->size = 0x400;
    x1a->count = 0;
    psVar1 = (s_x1node *)calloc(0x400,0x20);
    x1a->tbl = psVar1;
    if (x1a->tbl == (s_x1node *)0x0) {
      free(x1a);
      x1a = (s_x1 *)0x0;
    }
    else {
      x1a->ht = (s_x1node **)(x1a->tbl + 0x400);
      for (local_c = 0; local_c < 0x400; local_c = local_c + 1) {
        x1a->ht[local_c] = (s_x1node *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Strsafe_init(void){
  if( x1a ) return;
  x1a = (struct s_x1*)malloc( sizeof(struct s_x1) );
  if( x1a ){
    x1a->size = 1024;
    x1a->count = 0;
    x1a->tbl = (x1node*)calloc(1024, sizeof(x1node) + sizeof(x1node*));
    if( x1a->tbl==0 ){
      free(x1a);
      x1a = 0;
    }else{
      int i;
      x1a->ht = (x1node**)&(x1a->tbl[1024]);
      for(i=0; i<1024; i++) x1a->ht[i] = 0;
    }
  }
}